

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVMOVSRR(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t Val;
  uint32_t uVar5;
  uint uVar6;
  DecodeStatus DVar7;
  MCInst *in_RCX;
  uint32_t in_ESI;
  uint pred;
  uint Rm;
  uint Rt2;
  uint Rt;
  DecodeStatus S;
  uint64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar4 = fieldFromInstruction_4(in_ESI,5,1);
  Val = fieldFromInstruction_4(in_ESI,0x1c,4);
  uVar5 = fieldFromInstruction_4(in_ESI,0,4);
  uVar6 = uVar5 << 1 | uVar4;
  if (((uVar2 == 0xf) || (uVar3 == 0xf)) || (uVar6 == 0x1f)) {
    local_4 = MCDisassembler_SoftFail;
  }
  DVar7 = DecodeSPRRegisterClass
                    (in_RCX,local_4,CONCAT44(uVar3,uVar6),
                     (void *)CONCAT44(Val,in_stack_ffffffffffffffc0));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
  if (_Var1) {
    DVar7 = DecodeSPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar3,uVar6),
                       (void *)CONCAT44(Val,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
    if (_Var1) {
      DVar7 = DecodeGPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar3,uVar6),
                         (void *)CONCAT44(Val,in_stack_ffffffffffffffc0));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
      if (_Var1) {
        DVar7 = DecodeGPRRegisterClass
                          (in_RCX,local_4,CONCAT44(uVar3,uVar6),
                           (void *)CONCAT44(Val,in_stack_ffffffffffffffc0));
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
        if (_Var1) {
          DVar7 = DecodePredicateOperand
                            ((MCInst *)CONCAT44(uVar3,uVar6),Val,in_stack_ffffffffffffffb8,
                             (void *)0x283c0b);
          _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
          if (!_Var1) {
            local_4 = MCDisassembler_Fail;
          }
        }
        else {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVMOVSRR(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rt  = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm  = fieldFromInstruction_4(Insn,  5, 1);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	Rm |= fieldFromInstruction_4(Insn, 0, 4) << 1;

	if (Rt == 0xF || Rt2 == 0xF || Rm == 0x1F)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeSPRRegisterClass(Inst, Rm  , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeSPRRegisterClass(Inst, Rm+1, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt  , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt2 , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}